

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall
GEO::geofile::import_point
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  string *unaff_RBP;
  pointer pbVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_80;
  pair<const_int,_GEO::point> local_58;
  
  pbVar9 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = is_integer(pbVar9 + 1);
  if ((((bVar2) && (bVar2 = is_e_notation(pbVar9 + 2), bVar2)) &&
      (bVar2 = is_e_notation(pbVar9 + 3), bVar2)) && (bVar2 = is_e_notation(pbVar9 + 4), bVar2)) {
    unaff_RBP = pbVar9 + 5;
    bVar2 = is_e_notation(unaff_RBP);
    if (!bVar2) {
      iVar3 = std::__cxx11::string::compare((char *)unaff_RBP);
      pbVar9 = (split_string_vector->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)(pbVar9 + 5));
        pbVar9 = (split_string_vector->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (iVar3 != 0) goto LAB_0012c4cc;
      }
    }
  }
  else {
LAB_0012c4cc:
    iVar3 = std::__cxx11::string::compare((char *)(pbVar9 + 5));
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: Invalid value (line ",0x1b);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*line_number);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," of ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(import_path->_M_dataplus)._M_p,import_path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      return 1;
    }
    pbVar9 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  iVar8 = (int)unaff_RBP;
  pcVar1 = pbVar9[2]._M_dataplus._M_p;
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  *piVar5 = 0;
  dVar10 = strtod(pcVar1,(char **)&local_58);
  if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar1) {
    std::__throw_invalid_argument("stod");
LAB_0012c7d2:
    std::__throw_invalid_argument("stod");
LAB_0012c7de:
    std::__throw_invalid_argument("stod");
LAB_0012c7ea:
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar8 = *piVar5;
    if (iVar8 == 0) {
LAB_0012c5d3:
      *piVar5 = iVar3;
      iVar8 = iVar3;
    }
    else if (iVar8 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0012c5d3;
    }
    pcVar1 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
    *piVar5 = 0;
    dVar11 = strtod(pcVar1,(char **)&local_58);
    if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar1) goto LAB_0012c7d2;
    iVar3 = *piVar5;
    if (iVar3 == 0) {
LAB_0012c620:
      *piVar5 = iVar8;
      iVar3 = iVar8;
    }
    else if (iVar3 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0012c620;
    }
    pcVar1 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    *piVar5 = 0;
    dVar12 = strtod(pcVar1,(char **)&local_58);
    if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar1) goto LAB_0012c7de;
    if (*piVar5 == 0) {
LAB_0012c66c:
      *piVar5 = iVar3;
    }
    else if (*piVar5 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0012c66c;
    }
    iVar3 = std::__cxx11::string::compare
                      ((char *)((split_string_vector->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 5));
    if ((iVar3 == 0) ||
       (iVar3 = std::__cxx11::string::compare
                          ((char *)((split_string_vector->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 5)), iVar3 == 0)) {
LAB_0012c701:
      local_80 = this->mesh_spacing;
      iVar8 = *piVar5;
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((split_string_vector->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 5));
      iVar8 = *piVar5;
      if (iVar3 == 0) {
        local_80 = 0.0;
      }
      else {
        pcVar1 = (split_string_vector->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
        *piVar5 = 0;
        local_80 = strtod(pcVar1,(char **)&local_58);
        if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar1) goto LAB_0012c802;
        iVar3 = *piVar5;
        if (iVar3 == 0) {
          *piVar5 = iVar8;
        }
        else {
          iVar8 = iVar3;
          if (iVar3 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_0012c701;
          }
        }
      }
    }
    pcVar1 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    *piVar5 = 0;
    lVar6 = strtol(pcVar1,(char **)&local_58,10);
    if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar1) goto LAB_0012c7ea;
    local_58.first = (int)lVar6;
    if ((local_58.first == lVar6) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar8;
      }
      local_58.second.char_len = local_80;
      local_58.second.x = dVar10;
      local_58.second.y = dVar11;
      local_58.second.z = dVar12;
      std::
      _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
      ::_M_insert_unique<std::pair<int_const,GEO::point>>
                ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
                  *)&this->points_map,&local_58);
      return 0;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0012c802:
  uVar7 = std::__throw_invalid_argument("stod");
  if (*piVar5 == 0) {
    *piVar5 = iVar8;
  }
  _Unwind_Resume(uVar7);
}

Assistant:

int GEO::geofile::import_point( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    if ( (is_integer(split_string_vector[1])==true)&&
         (is_e_notation(split_string_vector[2])==true)&&
         (is_e_notation(split_string_vector[3])==true)&&
         (is_e_notation(split_string_vector[4])==true)&&
         ( (is_e_notation(split_string_vector[5])==true)||
           (split_string_vector[5]=="MeshSpac")||
           (split_string_vector[5]=="cl__1") )||
           (split_string_vector[5]==";") )
    {
        point input_point;
        input_point.x = std::stod(split_string_vector[2]);
        input_point.y = std::stod(split_string_vector[3]);
        input_point.z = std::stod(split_string_vector[4]);
        if( (split_string_vector[5]=="MeshSpac")||
            (split_string_vector[5]=="cl__1") )
        {
            input_point.char_len = mesh_spacing;
        }
        else
        {
            if (split_string_vector[5]!=";")
                input_point.char_len = std::stod(split_string_vector[5]);
            else
                input_point.char_len = 0;
        }
        points_map.insert({std::stoi(split_string_vector[1]), input_point});
        return EXIT_SUCCESS;
    }
    else
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
}